

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::HttpInputStreamImpl
          (HttpInputStreamImpl *this,AsyncInputStream *inner,HttpHeaderTable *table)

{
  HttpHeaderTable *table_local;
  AsyncInputStream *inner_local;
  HttpInputStreamImpl *this_local;
  
  HttpInputStream::HttpInputStream(&this->super_HttpInputStream);
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>::WrappableStreamMixin
            (&this->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>);
  (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)&PTR_readRequest_00c073c0;
  this->inner = inner;
  heapArray<char>(&this->headerBuffer,0x1000);
  this->messageHeaderEnd = 0;
  ArrayPtr<char>::ArrayPtr(&this->leftover);
  HttpHeaders::HttpHeaders(&this->headers,table);
  Maybe<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest>_>::Maybe
            (&this->resumingRequest);
  this->lineBreakBeforeNextHeader = false;
  this->broken = false;
  this->pendingMessageCount = 0;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe(&this->onMessageDone);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)&this->messageReadQueue);
  return;
}

Assistant:

explicit HttpInputStreamImpl(AsyncInputStream& inner, const HttpHeaderTable& table)
      : inner(inner), headerBuffer(kj::heapArray<char>(MIN_BUFFER)), headers(table) {
  }